

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Gridded_Data_PDU::Decode(Gridded_Data_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer pKVar1;
  pointer pKVar2;
  pointer pKVar3;
  pointer pKVar4;
  KUOCTET AxisType_00;
  unsigned_short uVar5;
  Gridded_Data_PDU *pGVar6;
  KUINT16 KVar7;
  GridAxisIrregular *pGVar8;
  KException *pKVar9;
  int iVar10;
  undefined7 in_register_00000011;
  byte bVar11;
  pointer pKVar12;
  pointer pKVar13;
  KUINT8 InterleafFactor;
  KUINT8 AxisType;
  KUINT16 SmpTyp;
  KUINT16 DtRep;
  KUINT16 PointsXi;
  KFLOAT64 FinalXi;
  KFLOAT64 InitialXi;
  KUOCTET local_88;
  KUOCTET local_87;
  unsigned_short local_86;
  unsigned_short local_84;
  unsigned_short local_82;
  Gridded_Data_PDU *local_80;
  KString local_78;
  double local_58;
  double local_50;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>
  *local_48;
  KUINT8 *local_40;
  KUINT8 *local_38;
  
  KVar7 = KDataStream::GetBufferSize(stream);
  iVar10 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar10 = 0;
  }
  if (iVar10 + (uint)KVar7 < 0x40) {
    pKVar9 = (KException *)__cxa_allocate_exception(0x30);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Decode","");
    KException::KException(pKVar9,&local_78,2);
    __cxa_throw(pKVar9,&KException::typeinfo,KException::~KException);
  }
  pKVar1 = (this->m_vpGridAxisDesc).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vpGridAxisDesc).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar12 = pKVar1;
  local_80 = this;
  if (pKVar2 != pKVar1) {
    do {
      (**pKVar12->_vptr_KRef_Ptr)(pKVar12);
      pKVar12 = pKVar12 + 1;
    } while (pKVar12 != pKVar2);
    (local_80->m_vpGridAxisDesc).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1;
  }
  pKVar3 = (local_80->m_vGridData).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar4 = (local_80->m_vGridData).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar13 = pKVar3;
  if (pKVar4 != pKVar3) {
    do {
      (**pKVar13->_vptr_KRef_Ptr)(pKVar13);
      pKVar13 = pKVar13 + 1;
    } while (pKVar13 != pKVar4);
    (local_80->m_vGridData).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar3;
  }
  pGVar6 = local_80;
  Header7::Decode(&local_80->super_Header,stream,ignoreHeader);
  (*(pGVar6->m_EnvProcID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&pGVar6->m_EnvProcID,stream);
  KDataStream::Read<unsigned_short>(stream,&pGVar6->m_ui16FieldNum);
  KDataStream::Read<unsigned_short>(stream,&pGVar6->m_ui16PDUNum);
  KDataStream::Read<unsigned_short>(stream,&pGVar6->m_ui16PDUTotal);
  KDataStream::Read<unsigned_short>(stream,&pGVar6->m_ui16CordSys);
  local_38 = &pGVar6->m_ui8NumAxis;
  KDataStream::Read(stream,local_38);
  KDataStream::Read(stream,&pGVar6->m_ui8ConstGrid);
  (*(pGVar6->m_EnvType).super_DataTypeBase._vptr_DataTypeBase[3])(&pGVar6->m_EnvType,stream);
  (*(pGVar6->m_Ori).super_DataTypeBase._vptr_DataTypeBase[3])(&pGVar6->m_Ori,stream);
  KDataStream::Read<unsigned_long_long>(stream,&pGVar6->m_ui64SampleTime);
  KDataStream::Read<unsigned_int>(stream,&pGVar6->m_ui32TotalValues);
  local_40 = &pGVar6->m_ui8VecDim;
  KDataStream::Read(stream,local_40);
  KDataStream::Read<unsigned_short>(stream,&pGVar6->m_ui16Padding1);
  KDataStream::Read(stream,&pGVar6->m_ui8Padding1);
  local_50 = 0.0;
  local_58 = 0.0;
  local_82 = 0;
  local_88 = '\0';
  local_87 = '\0';
  if (pGVar6->m_ui8NumAxis != '\0') {
    local_48 = (vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>
                *)&local_80->m_vpGridAxisDesc;
    bVar11 = 0;
    do {
      KDataStream::Read<double>(stream,&local_50);
      KDataStream::Read<double>(stream,&local_58);
      KDataStream::Read<unsigned_short>(stream,&local_82);
      KDataStream::Read(stream,&local_88);
      KDataStream::Read(stream,&local_87);
      AxisType_00 = local_87;
      if (local_87 == '\0') {
        pGVar8 = (GridAxisIrregular *)operator_new(0x20);
        DATA_TYPE::GridAxisRegular::GridAxisRegular
                  ((GridAxisRegular *)pGVar8,(KFLOAT64)local_50,(KFLOAT64)local_58,local_82,local_88
                   ,'\0',stream);
        local_78._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00224308;
        local_78._M_string_length = (size_type)pGVar8;
        local_78.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_78.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>
                  (local_48,(KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *)&local_78);
      }
      else {
        pGVar8 = (GridAxisIrregular *)operator_new(0x60);
        DATA_TYPE::GridAxisIrregular::GridAxisIrregular
                  (pGVar8,(KFLOAT64)local_50,(KFLOAT64)local_58,local_82,local_88,AxisType_00,stream
                  );
        local_78._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00224308;
        local_78._M_string_length = (size_type)pGVar8;
        local_78.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_78.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>
                  (local_48,(KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *)&local_78);
      }
      local_78._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00224308;
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>::unRef
                ((KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *)&local_78);
      bVar11 = bVar11 + 1;
    } while (bVar11 < *local_38);
  }
  local_86 = 0;
  local_84 = 0;
  if (*local_40 == '\0') {
    return;
  }
  local_80 = (Gridded_Data_PDU *)&local_80->m_vGridData;
  KDataStream::Read<unsigned_short>(stream,&local_86);
  KDataStream::Read<unsigned_short>(stream,&local_84);
  if (local_84 != 2) {
    if (local_84 != 1) {
      if (local_84 != 0) goto LAB_0016b63f;
      pGVar8 = (GridAxisIrregular *)operator_new(0x30);
      DATA_TYPE::GridDataType0::GridDataType0((GridDataType0 *)pGVar8,local_86,0,stream);
      local_78._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00224338;
      local_78._M_string_length = (size_type)pGVar8;
      local_78.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_78.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>
                  *)local_80,(KRef_Ptr<KDIS::DATA_TYPE::GridData> *)&local_78);
      local_78._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00224338;
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::unRef
                ((KRef_Ptr<KDIS::DATA_TYPE::GridData> *)&local_78);
    }
    uVar5 = local_84;
    pGVar8 = (GridAxisIrregular *)operator_new(0x38);
    DATA_TYPE::GridDataType1::GridDataType1((GridDataType1 *)pGVar8,local_86,uVar5,stream);
    local_78._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00224338;
    local_78._M_string_length = (size_type)pGVar8;
    local_78.field_2._M_allocated_capacity = (size_type)operator_new(2);
    *(undefined2 *)local_78.field_2._M_allocated_capacity = 1;
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>
    ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>
              ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>
                *)local_80,(KRef_Ptr<KDIS::DATA_TYPE::GridData> *)&local_78);
    local_78._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00224338;
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::unRef
              ((KRef_Ptr<KDIS::DATA_TYPE::GridData> *)&local_78);
  }
  uVar5 = local_84;
  pGVar8 = (GridAxisIrregular *)operator_new(0x30);
  DATA_TYPE::GridDataType2::GridDataType2((GridDataType2 *)pGVar8,local_86,uVar5,stream);
  local_78._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00224338;
  local_78._M_string_length = (size_type)pGVar8;
  local_78.field_2._M_allocated_capacity = (size_type)operator_new(2);
  *(undefined2 *)local_78.field_2._M_allocated_capacity = 1;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>
  ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>
            ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>
              *)local_80,(KRef_Ptr<KDIS::DATA_TYPE::GridData> *)&local_78);
  local_78._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00224338;
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::unRef
            ((KRef_Ptr<KDIS::DATA_TYPE::GridData> *)&local_78);
LAB_0016b63f:
  pKVar9 = (KException *)__cxa_allocate_exception(0x30);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Decode","");
  KException::KException<char_const*>(pKVar9,&local_78,9,"Unknown Grid Data Representation");
  __cxa_throw(pKVar9,&KException::typeinfo,KException::~KException);
}

Assistant:

void Gridded_Data_PDU::Decode(KDataStream &stream, bool ignoreHeader) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < GRIDDED_DATA_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vpGridAxisDesc.clear();
    m_vGridData.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EnvProcID
           >> m_ui16FieldNum
           >> m_ui16PDUNum
           >> m_ui16PDUTotal
           >> m_ui16CordSys
           >> m_ui8NumAxis
           >> m_ui8ConstGrid
           >> KDIS_STREAM m_EnvType
           >> KDIS_STREAM m_Ori
           >> m_ui64SampleTime
           >> m_ui32TotalValues
           >> m_ui8VecDim
           >> m_ui16Padding1
           >> m_ui8Padding1;

    // We must first decode 4 other values before we can get to the grid axis type so
    // a special constructor is provided in the grid axis classes so that we can pass half the decoded data.
    KFLOAT64 InitialXi = 0;
    KFLOAT64 FinalXi = 0;
    KUINT16 PointsXi = 0;
    KUINT8 InterleafFactor = 0;
    KUINT8 AxisType = 0;
    for( KUINT8 i = 0; i < m_ui8NumAxis; ++i )
    {
        stream >> InitialXi
               >> FinalXi
               >> PointsXi
               >> InterleafFactor
               >> AxisType;

        if( AxisType == 0 )
        {
            // Regular grid
            m_vpGridAxisDesc.push_back( new GridAxisRegular( InitialXi, FinalXi, PointsXi, InterleafFactor, AxisType, stream ) );
        }
        else
        {
            // Irregular grid.
            m_vpGridAxisDesc.push_back( new GridAxisIrregular( InitialXi, FinalXi, PointsXi, InterleafFactor, AxisType, stream ) );
        }
    }

    // We must first decode 2 other values before we can get to the grid data type so
    // a special constructor is provided in the grid data type classes so that we can pass half the decoded data.
    KUINT16 SmpTyp = 0;
    KUINT16 DtRep = 0;

    for( KUINT8 j = 0; j < m_ui8VecDim; ++j )
    {
        stream >> SmpTyp
               >> DtRep;

        switch( DtRep )
        {
        case 0:
            m_vGridData.push_back( new GridDataType0( SmpTyp, DtRep, stream ) );
        case 1 :
            m_vGridData.push_back( new GridDataType1( SmpTyp, DtRep, stream ) );
        case 2:
            m_vGridData.push_back( new GridDataType2( SmpTyp, DtRep, stream ) );
        default:
            throw KException( __FUNCTION__, UNSUPPORTED_DATATYPE, "Unknown Grid Data Representation" );
        }
    }
}